

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidgetPrivate::removeSubFocusHelper
          (QGraphicsProxyWidgetPrivate *this,QWidget *widget,FocusReason reason)

{
  int *piVar1;
  QObject *pQVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFocusEvent::QFocusEvent((QFocusEvent *)&local_38,FocusOut,reason);
  if (widget == (QWidget *)0x0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
  }
  QCoreApplication::sendEvent(&widget->super_QObject,(QEvent *)&local_38);
  if (piVar1 != (int *)0x0) {
    if (((widget != (QWidget *)0x0) && (piVar1[1] != 0)) && (uStack_30._4_1_ == '\x01')) {
      pQVar2 = &QWidget::style(widget)->super_QObject;
      QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_38);
    }
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        operator_delete(piVar1);
      }
    }
  }
  QFocusEvent::~QFocusEvent((QFocusEvent *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::removeSubFocusHelper(QWidget *widget, Qt::FocusReason reason)
{
    QFocusEvent event(QEvent::FocusOut, reason);
    QPointer<QWidget> widgetGuard = widget;
    QCoreApplication::sendEvent(widget, &event);
    if (widgetGuard && event.isAccepted())
        QCoreApplication::sendEvent(widget->style(), &event);
}